

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

void __thiscall QOpenGLTexture::borderColor(QOpenGLTexture *this,float *border)

{
  QOpenGLTexturePrivate *pQVar1;
  int i;
  long lVar2;
  float fVar3;
  
  pQVar1 = (this->d_ptr).d;
  if ((pQVar1->borderColor).d.size == 0) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      border[lVar2] = 0.0;
    }
  }
  else {
    for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
      fVar3 = (float)QVariant::toFloat((bool *)((long)&(((pQVar1->borderColor).d.ptr)->d).data +
                                               lVar2));
      *border = fVar3;
      border = border + 1;
    }
  }
  return;
}

Assistant:

void QOpenGLTexture::borderColor(float *border) const
{
    Q_D(const QOpenGLTexture);
    Q_ASSERT(border);
    if (d->borderColor.isEmpty()) {
        for (int i = 0; i < 4; ++i)
            border[i] = 0.0f;
    } else {
        for (int i = 0; i < 4; ++i)
            border[i] = d->borderColor.at(i).toFloat();
    }
}